

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSynchWaitController::RegisterWaitingThread
          (CSynchWaitController *this,WaitType wtWaitType,DWORD dwIndex,bool fAlertable)

{
  LONG *pLVar1;
  ObjectDomain OVar2;
  CSynchData *this_00;
  uint uVar3;
  CPalSynchronizationManager *pCVar4;
  PAL_ERROR PVar5;
  int iVar6;
  LONG LVar7;
  CPalThread *pCVar8;
  ThreadWaitInfo *ptwiWaitInfo;
  WaitingThreadsListNode *pwtlnNewNode;
  SynchDataGenrPtr SVar9;
  CProcProcessLocalData *pProcLocalData;
  ulong uVar10;
  undefined7 in_register_00000009;
  CPalThread *pthrCurrent;
  _WaitingThreadsListNode *shridObj_00;
  bool bVar11;
  _WaitingThreadsListNode *local_70;
  SHMPTR shridObj;
  WaitingThreadsListNode *local_60;
  uint local_54;
  CPalSynchronizationManager *local_50;
  undefined8 local_48;
  ObjectDomain local_3c;
  ThreadWaitInfo *local_38;
  
  pCVar4 = CPalSynchronizationManager::s_pObjSynchMgr;
  local_54 = (uint)CONCAT71(in_register_00000009,fAlertable);
  local_48 = (WaitingThreadsListNode *)CONCAT44(local_48._4_4_,dwIndex);
  local_38 = (ThreadWaitInfo *)CONCAT44(local_38._4_4_,wtWaitType);
  OVar2 = (this->super_CSynchControllerBase).m_odObjectDomain;
  pCVar8 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar8 == (CPalThread *)0x0) {
    pCVar8 = CreateCurrentThreadData();
  }
  pthrCurrent = (this->super_CSynchControllerBase).m_pthrOwner;
  if (pCVar8 != pthrCurrent) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x115);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
    pthrCurrent = (this->super_CSynchControllerBase).m_pthrOwner;
  }
  ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo(pthrCurrent);
  pCVar8 = (this->super_CSynchControllerBase).m_pthrOwner;
  if (ptwiWaitInfo->pthrOwner != pCVar8) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x11a);
    fprintf(_stderr,"Expression: ptwiWaitInfo->pthrOwner == m_pthrOwner\n");
    pCVar8 = (this->super_CSynchControllerBase).m_pthrOwner;
  }
  shridObj = (SHMPTR)SHMPtrToPtr((pCVar8->synchronizationInfo).m_shridWaitAwakened);
  pCVar8 = (this->super_CSynchControllerBase).m_pthrOwner;
  local_50 = pCVar4;
  local_3c = OVar2;
  if (OVar2 == SharedObject) {
    local_70 = (WaitingThreadsListNode *)0x0;
    CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
              (&pCVar4->m_cacheSHRWTListNodes,pCVar8,1,(SHMPTR *)&local_70);
    shridObj_00 = local_70;
    pwtlnNewNode = (WaitingThreadsListNode *)SHMPtrToPtr((SHMPTR)local_70);
  }
  else {
    local_70 = (WaitingThreadsListNode *)0x0;
    CSynchCache<CorUnix::_WaitingThreadsListNode>::Get
              (&pCVar4->m_cacheWTListNodes,pCVar8,1,&local_70);
    shridObj_00 = (WaitingThreadsListNode *)0x0;
    pwtlnNewNode = local_70;
  }
  if (pwtlnNewNode == (WaitingThreadsListNode *)0x0) {
    if (shridObj_00 == (WaitingThreadsListNode *)0x0 || local_3c != SharedObject) {
      PVar5 = 8;
      local_48 = (WaitingThreadsListNode *)0x0;
      local_38 = ptwiWaitInfo;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00342424;
      goto LAB_0034210b;
    }
    local_48 = pwtlnNewNode;
    local_38 = ptwiWaitInfo;
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x12d);
    fprintf(_stderr,"Bad Shared Memory ptr %p\n",shridObj_00);
  }
  else {
    if (ptwiWaitInfo->lObjCount < 0x40) {
      if (ptwiWaitInfo->lObjCount == 0) {
        ptwiWaitInfo->wtWaitType = (WaitType)local_38;
        ptwiWaitInfo->wdWaitDomain = (this->super_CSynchControllerBase).m_wdWaitDomain;
      }
      else {
        if (ptwiWaitInfo->wtWaitType != (WaitType)local_38) {
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x147);
          fprintf(_stderr,
                  "Expression: wtWaitType == ptwiWaitInfo->wtWaitType, Description: Conflicting wait types in wait registration\n"
                 );
        }
        if ((this->super_CSynchControllerBase).m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain) {
          ptwiWaitInfo->wdWaitDomain = MixedWait;
        }
      }
      uVar3 = (uint)((WaitType)local_38 == 2) * 2;
      pwtlnNewNode->shridSHRThis = 0;
      pwtlnNewNode->ptwiWaitInfo = ptwiWaitInfo;
      pwtlnNewNode->dwObjIndex = (DWORD)local_48;
      pwtlnNewNode->dwProcessId = gPID;
      pCVar8 = (this->super_CSynchControllerBase).m_pthrOwner;
      pwtlnNewNode->dwThreadId = (DWORD)pCVar8->m_threadId;
      pwtlnNewNode->dwFlags = uVar3;
      pwtlnNewNode->shridWaitingState = (pCVar8->synchronizationInfo).m_shridWaitAwakened;
      if (local_3c == SharedObject) {
        pwtlnNewNode->dwFlags = uVar3 | 1;
        pwtlnNewNode->shridSHRThis = (SHMPTR)shridObj_00;
        SVar9 = (SynchDataGenrPtr)((this->super_CSynchControllerBase).m_psdSynchData)->m_shridThis;
      }
      else {
        SVar9 = (SynchDataGenrPtr)(this->super_CSynchControllerBase).m_psdSynchData;
      }
      pwtlnNewNode->ptrOwnerObjSynchData = SVar9;
      LOCK();
      pLVar1 = &((this->super_CSynchControllerBase).m_psdSynchData)->m_lRefCount;
      *pLVar1 = *pLVar1 + 1;
      UNLOCK();
      iVar6 = ptwiWaitInfo->lObjCount;
      ptwiWaitInfo->rgpWTLNodes[iVar6] = pwtlnNewNode;
      local_60 = shridObj_00;
      if (((this->super_CSynchControllerBase).m_psdSynchData)->m_otiObjectTypeId == otiProcess) {
        pProcLocalData = GetProcessLocalData(this);
        if (pProcLocalData != (CProcProcessLocalData *)0x0) {
          PVar5 = CPalSynchronizationManager::RegisterProcessForMonitoring
                            (local_50,(this->super_CSynchControllerBase).m_pthrOwner,
                             (this->super_CSynchControllerBase).m_psdSynchData,pProcLocalData);
          if (PVar5 != 0) {
            local_38 = (ThreadWaitInfo *)CONCAT44(local_38._4_4_,PVar5);
            local_48 = (WaitingThreadsListNode *)((ulong)local_48 & 0xffffffff00000000);
            goto LAB_0034235a;
          }
          iVar6 = ptwiWaitInfo->lObjCount;
          goto LAB_00342299;
        }
        local_48 = (WaitingThreadsListNode *)((ulong)local_48 & 0xffffffff00000000);
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x172);
        fprintf(_stderr,"Process synch data pointer is missing\n");
      }
      else {
LAB_00342299:
        if (iVar6 != 0) {
LAB_0034229d:
          this_00 = (this->super_CSynchControllerBase).m_psdSynchData;
          if (local_3c == SharedObject) {
            CSynchData::SharedWaiterEnqueue(this_00,(SHMPTR)local_60);
            ptwiWaitInfo->lSharedObjCount = ptwiWaitInfo->lSharedObjCount + 1;
          }
          else {
            CSynchData::WaiterEnqueue(this_00,pwtlnNewNode);
          }
          ptwiWaitInfo->lObjCount = ptwiWaitInfo->lObjCount + 1;
          return 0;
        }
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_00342424:
          abort();
        }
        uVar10 = 0;
        LOCK();
        if (*(uint *)shridObj == 0) {
          *(uint *)shridObj = (local_54 & 0xff) + 1;
        }
        else {
          uVar10 = (ulong)*(uint *)shridObj;
        }
        UNLOCK();
        if ((int)uVar10 == 0) goto LAB_0034229d;
        if ((int)uVar10 == 3) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00342424;
          local_38 = (ThreadWaitInfo *)CONCAT44(local_38._4_4_,0xffffffff);
          local_48 = (WaitingThreadsListNode *)
                     CONCAT44(local_48._4_4_,(int)CONCAT71((int7)(uVar10 >> 8),1));
          goto LAB_0034235a;
        }
        local_48 = (WaitingThreadsListNode *)((ulong)local_48._4_4_ << 0x20);
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x19a);
        fprintf(_stderr,"Unexpected thread wait state %d\n",uVar10);
      }
      local_38 = (ThreadWaitInfo *)CONCAT44(local_38._4_4_,0x54f);
LAB_0034235a:
      pCVar4 = local_50;
      bVar11 = local_3c == SharedObject;
      CPalSynchronizationManager::UnRegisterWait
                (local_50,(this->super_CSynchControllerBase).m_pthrOwner,ptwiWaitInfo,bVar11);
      CSynchData::Release((this->super_CSynchControllerBase).m_psdSynchData,
                          (this->super_CSynchControllerBase).m_pthrOwner);
      pCVar8 = (this->super_CSynchControllerBase).m_pthrOwner;
      if (bVar11 && local_60 != (WaitingThreadsListNode *)0x0) {
        CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&pCVar4->m_cacheSHRWTListNodes,pCVar8,(SHMPTR)local_60);
      }
      else {
        CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&pCVar4->m_cacheWTListNodes,pCVar8,pwtlnNewNode);
      }
      if ((char)local_48 != '\0') {
        CPalSynchronizationManager::ResetSharedSynchLock
                  ((this->super_CSynchControllerBase).m_pthrOwner);
        LVar7 = CPalSynchronizationManager::ResetLocalSynchLock
                          ((this->super_CSynchControllerBase).m_pthrOwner);
        if (LVar7 < 1) {
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x1cd);
          fprintf(_stderr,"Expression: 0 < lLocalSynchLockCount\n");
        }
        CPalSynchronizationManager::ThreadPrepareForShutdown();
      }
      return (WaitType)local_38;
    }
    local_48 = pwtlnNewNode;
    local_38 = ptwiWaitInfo;
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x13a);
    fprintf(_stderr,"Too many objects");
  }
  PVar5 = 0x54f;
  pwtlnNewNode = local_48;
LAB_0034210b:
  local_48 = pwtlnNewNode;
  pCVar4 = local_50;
  bVar11 = local_3c == SharedObject;
  CPalSynchronizationManager::UnRegisterWait
            (local_50,(this->super_CSynchControllerBase).m_pthrOwner,local_38,bVar11);
  if (shridObj_00 == (WaitingThreadsListNode *)0x0 || !bVar11) {
    if (local_48 != (_WaitingThreadsListNode *)0x0) {
      CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                (&pCVar4->m_cacheWTListNodes,(this->super_CSynchControllerBase).m_pthrOwner,local_48
                );
    }
  }
  else {
    CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
              (&pCVar4->m_cacheSHRWTListNodes,(this->super_CSynchControllerBase).m_pthrOwner,
               (SHMPTR)shridObj_00);
  }
  return PVar5;
}

Assistant:

PAL_ERROR CSynchWaitController::RegisterWaitingThread(
        WaitType wtWaitType,
        DWORD dwIndex,
        bool fAlertable)
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;
        WaitingThreadsListNode * pwtlnNewNode = NULL;
        SharedID shridNewNode = NULLSharedID;
        ThreadWaitInfo * ptwiWaitInfo; 
        DWORD * pdwWaitState;
        bool fSharedObject = (SharedObject == m_odObjectDomain);
        bool fEarlyDeath = false;
        bool fSynchDataRefd = false;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        
        ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo(
            m_pthrOwner);

        _ASSERTE(ptwiWaitInfo->pthrOwner == m_pthrOwner);
        
        pdwWaitState = SharedIDToTypePointer(DWORD,
                m_pthrOwner->synchronizationInfo.m_shridWaitAwakened);

        if (fSharedObject)
        {
            shridNewNode = pSynchManager->CacheGetSharedWTListNode(m_pthrOwner);
            pwtlnNewNode = SharedIDToTypePointer(WaitingThreadsListNode, shridNewNode);
        }
        else
        {
            pwtlnNewNode = pSynchManager->CacheGetLocalWTListNode(m_pthrOwner);
        }
        
        if (!pwtlnNewNode)
        {
            if (fSharedObject && (NULLSharedID != shridNewNode))
            {
                ASSERT("Bad Shared Memory ptr %p\n", shridNewNode);
                palErr = ERROR_INTERNAL_ERROR;
            }        
            else
            {
                ERROR("Out of memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            goto RWT_exit;        
        }

        if (ptwiWaitInfo->lObjCount >= MAXIMUM_WAIT_OBJECTS)
        {
            ASSERT("Too many objects");
            palErr = ERROR_INTERNAL_ERROR; 
            goto RWT_exit;
        }       

        if (0 == ptwiWaitInfo->lObjCount)
        {
            ptwiWaitInfo->wtWaitType = wtWaitType;
            ptwiWaitInfo->wdWaitDomain = m_wdWaitDomain;
        } 
        else 
        {
            _ASSERT_MSG(wtWaitType == ptwiWaitInfo->wtWaitType,
                        "Conflicting wait types in wait registration\n");
            
            if (m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain)
            {
                ptwiWaitInfo->wdWaitDomain = MixedWait;
            }
        }
        
        pwtlnNewNode->shridSHRThis       = NULLSharedID;
        pwtlnNewNode->ptwiWaitInfo       = ptwiWaitInfo;
        pwtlnNewNode->dwObjIndex         = dwIndex;
        pwtlnNewNode->dwProcessId        = gPID;
        pwtlnNewNode->dwThreadId         = m_pthrOwner->GetThreadId();
        pwtlnNewNode->dwFlags            = (MultipleObjectsWaitAll == wtWaitType) ? 
                                            WTLN_FLAG_WAIT_ALL : 0;
        pwtlnNewNode->shridWaitingState  = m_pthrOwner->synchronizationInfo.m_shridWaitAwakened; 
        if (fSharedObject)
        {
            pwtlnNewNode->dwFlags                   |= WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
            pwtlnNewNode->shridSHRThis               = shridNewNode;
            pwtlnNewNode->ptrOwnerObjSynchData.shrid = m_psdSynchData->GetSharedThis();
        }
        else
        {
            pwtlnNewNode->ptrOwnerObjSynchData.ptr = m_psdSynchData;
        }
        
        // AddRef the synch data (will be released in UnregisterWait)
        m_psdSynchData->AddRef();
        fSynchDataRefd = true;

        ptwiWaitInfo->rgpWTLNodes[ptwiWaitInfo->lObjCount] = pwtlnNewNode;

        if(otiProcess == m_psdSynchData->GetObjectTypeId())
        {
            CProcProcessLocalData * pProcLocalData = GetProcessLocalData();

            if (NULL == pProcLocalData)
            {
                // Process local data pointer not set in the controller.
                // This pointer is set in CSynchWaitController only when the
                // wait controller for the object is created by calling
                // GetSynchWaitControllersForObjects
                ASSERT("Process synch data pointer is missing\n");
                palErr = ERROR_INTERNAL_ERROR;
                goto RWT_exit;
            }
            
            palErr = pSynchManager->RegisterProcessForMonitoring(m_pthrOwner,
                                                                 m_psdSynchData, 
                                                                 pProcLocalData);            
            if (NO_ERROR != palErr)
            {
                goto RWT_exit;
            }
        }
        
        if (0 == ptwiWaitInfo->lObjCount)
        {
            DWORD dwWaitState;

            // Setting the thread in wait state 
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE: TWS_WAITING);

            TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u \n", 
                  pdwWaitState, dwWaitState);

            dwWaitState = InterlockedCompareExchange(
                (LONG *)pdwWaitState, (LONG)dwWaitState, TWS_ACTIVE);
            if ((DWORD)TWS_ACTIVE != dwWaitState)
            {
                if ((DWORD)TWS_EARLYDEATH == dwWaitState)
                {
                    // Process is terminating, this thread will soon be 
                    // suspended (by SuspendOtherThreads).
                    WARN("Thread is about to get suspended by "
                         "TerminateProcess\n");

                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                }
                else
                {
                    ASSERT("Unexpected thread wait state %d\n", dwWaitState);
                    palErr = ERROR_INTERNAL_ERROR;
                }
                goto RWT_exit;
            }
        }

        // Add new node to queue
        if (fSharedObject)
        {
            m_psdSynchData->SharedWaiterEnqueue(shridNewNode);
            ptwiWaitInfo->lSharedObjCount += 1;
        }
        else
        {
            m_psdSynchData->WaiterEnqueue(pwtlnNewNode);
        }

        // Succeeded: update object count
        ptwiWaitInfo->lObjCount++;

    RWT_exit:
        if (palErr != NO_ERROR)
        {
            // Unregister any partial wait registration
            pSynchManager->UnRegisterWait(m_pthrOwner, ptwiWaitInfo, fSharedObject);
            
            if (fSynchDataRefd)
            {
                m_psdSynchData->Release(m_pthrOwner);
            }
            if ((fSharedObject)  && (NULLSharedID != shridNewNode))
            {
                pSynchManager->CacheAddSharedWTListNode(m_pthrOwner, shridNewNode);
            }
            else if (NULL != pwtlnNewNode)
            {
                pSynchManager->CacheAddLocalWTListNode(m_pthrOwner, pwtlnNewNode);
            }

            if (fEarlyDeath)
            {
                // Early death detected, i.e. the process is about to exit. 
                // We need to completely release the synch lock(s) before
                // going to sleep
                LONG lLocalSynchLockCount; 
                LONG lSharedSynchLockCount;
                                          
                lSharedSynchLockCount = CPalSynchronizationManager::ResetSharedSynchLock(m_pthrOwner);
                lLocalSynchLockCount = CPalSynchronizationManager::ResetLocalSynchLock(m_pthrOwner);

                _ASSERTE(0 < lLocalSynchLockCount);

                // Sleep for ever                
                CPalSynchronizationManager::ThreadPrepareForShutdown();
            }
        }
#ifdef SYNCH_STATISTICS
        else
        {
            m_psdSynchData->IncrementStatWaitCount();
            m_psdSynchData->IncrementStatContentionCount();
        }
#endif        
        return palErr;
    }